

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

string * __thiscall
anon_unknown.dwarf_173a2e3::FeaturePlaceHolderExpander::ExpandVariable
          (string *__return_storage_ptr__,FeaturePlaceHolderExpander *this,string *variable)

{
  pointer pcVar1;
  int iVar2;
  
  if (this->Library != (string *)0x0) {
    iVar2 = std::__cxx11::string::compare((char *)variable);
    if (iVar2 == 0) {
      variable = this->Library;
      goto LAB_00413db6;
    }
  }
  if (this->LibItem != (string *)0x0) {
    iVar2 = std::__cxx11::string::compare((char *)variable);
    if (iVar2 == 0) {
      variable = this->LibItem;
      goto LAB_00413db6;
    }
  }
  if (this->LinkItem != (string *)0x0) {
    iVar2 = std::__cxx11::string::compare((char *)variable);
    if (iVar2 == 0) {
      variable = this->LinkItem;
    }
  }
LAB_00413db6:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (variable->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + variable->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string ExpandVariable(std::string const& variable) override
  {
    if (this->Library != nullptr && variable == "LIBRARY") {
      return *this->Library;
    }
    if (this->LibItem != nullptr && variable == "LIB_ITEM") {
      return *this->LibItem;
    }
    if (this->LinkItem != nullptr && variable == "LINK_ITEM") {
      return *this->LinkItem;
    }

    return variable;
  }